

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinDeserializer<boost::optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>,_void>
     ::deserialize<InputStream>
               (optional<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *opt,
               InputStream *istream)

{
  uint8_t discriminator;
  uint32_t size;
  char local_39;
  optional_base<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> local_38;
  
  std::istream::read((char *)istream->stream,(long)&local_39);
  if (local_39 == '\0') {
    local_38._0_4_ = local_38._0_4_ & 0xffffff00;
    boost::optional_detail::
    optional_base<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>::assign
              (&opt->super_type,&local_38);
    if ((local_38.m_initialized == true) && (local_38.m_storage.dummy_.aligner_ != (type)0x0)) {
      operator_delete((void *)local_38.m_storage.dummy_.aligner_,
                      local_38.m_storage.dummy_._16_8_ - local_38.m_storage.dummy_._0_8_);
    }
  }
  else {
    BuiltinDeserializer<boost::optional<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>,void>
    ::make_nonempty<boost::optional<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>>
              (opt);
    std::istream::read((char *)istream->stream,(long)&local_38);
    BuiltinDeserializer<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_void>::
    deserialize_elems<InputStream>(&(opt->super_type).m_storage,local_38._0_4_,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }